

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::core::Privkey::CreateTweakMul(Privkey *__return_storage_ptr__,Privkey *this,Privkey *tweak)

{
  ByteData256 local_50;
  undefined1 local_38 [8];
  ByteData tweak_muled;
  Privkey *tweak_local;
  Privkey *this_local;
  
  tweak_muled.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tweak;
  ByteData256::ByteData256(&local_50,&tweak->data_);
  WallyUtil::MulTweakPrivkey((ByteData *)local_38,&this->data_,&local_50);
  ByteData256::~ByteData256(&local_50);
  Privkey(__return_storage_ptr__,(ByteData *)local_38,kMainnet,true);
  ByteData::~ByteData((ByteData *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::CreateTweakMul(const Privkey &tweak) const {
  ByteData tweak_muled =
      WallyUtil::MulTweakPrivkey(data_, ByteData256(tweak.data_));
  return Privkey(tweak_muled);
}